

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

bool __thiscall cmCTest::CheckArgument(cmCTest *this,string *arg,char *varg1,char *varg2)

{
  int iVar1;
  bool bVar2;
  
  if ((varg1 != (char *)0x0) && (iVar1 = std::__cxx11::string::compare((char *)arg), iVar1 == 0)) {
    return true;
  }
  if (varg2 == (char *)0x0) {
    bVar2 = false;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)arg);
    bVar2 = iVar1 == 0;
  }
  return bVar2;
}

Assistant:

bool cmCTest::CheckArgument(const std::string& arg, const char* varg1,
  const char* varg2)
{
  return (varg1 && arg == varg1) || (varg2 && arg == varg2);
}